

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

int match_list(int *acc,char **str,size_t *len,char *lst,size_t lstlen,date_parse_string *capture)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  int local_88;
  int idx;
  ulong local_80;
  char *curstr;
  int *local_60;
  date_parse_string *local_58;
  size_t curlen;
  date_parse_string part;
  
  local_60 = acc;
  local_58 = capture;
  while ((lstlen != 0 && (iVar2 = is_space((int)*lst), iVar2 != 0))) {
    lst = lst + 1;
    lstlen = lstlen - 1;
  }
  idx = 1;
  local_80 = 0;
  local_88 = 0;
LAB_0024b049:
  do {
    if (lstlen == 0) goto LAB_0024b14b;
    uVar6 = 0;
    while ((uVar8 = lstlen - uVar6, uVar3 = lstlen, uVar8 != 0 &&
           ((0x3d < (ulong)(byte)lst[uVar6] ||
            (uVar3 = uVar6, (0x2800100000000000U >> ((ulong)(byte)lst[uVar6] & 0x3f) & 1) == 0)))))
    {
      uVar6 = uVar6 + 1;
    }
    pcVar7 = lst + uVar3;
    curstr = *str;
    curlen = *len;
    part.p = (char *)0x0;
    part.len = 0;
    if (((long)pcVar7 - (long)lst != 0) &&
       (iVar2 = match_lit(&curstr,&curlen,lst,(long)pcVar7 - (long)lst,&part), iVar2 != 0)) {
      uVar3 = (long)curstr - (long)*str;
      lVar5 = (long)(int)local_80;
      if (lVar5 < (long)uVar3) {
        local_80 = uVar3;
      }
      local_80 = local_80 & 0xffffffff;
      if (lVar5 < (long)uVar3) {
        local_88 = idx;
      }
    }
    if (lstlen == uVar6) goto LAB_0024b14b;
    cVar1 = *pcVar7;
    lst = pcVar7;
    if (cVar1 == ',') {
      idx = idx + 1;
      do {
        lst = lst + 1;
        if (uVar8 == 1) {
          lstlen = 0;
          break;
        }
        iVar2 = is_space((int)*lst);
        uVar8 = uVar8 - 1;
        lstlen = uVar8;
      } while (iVar2 != 0);
      goto LAB_0024b049;
    }
    if (cVar1 == '=') {
      lst = pcVar7 + 1;
      lstlen = ~uVar6 + lstlen;
    }
    else {
      lstlen = uVar8;
      if (cVar1 == ';') {
LAB_0024b14b:
        if ((int)local_80 != 0) {
          local_58->p = *str;
          sVar4 = (size_t)(int)local_80;
          local_58->len = sVar4;
          *local_60 = local_88;
          *str = *str + sVar4;
          *len = *len - sVar4;
        }
        return (uint)((int)local_80 != 0);
      }
    }
  } while( true );
}

Assistant:

static int match_list(int &acc, const char *&str, size_t &len,
                      const char *lst, size_t lstlen,
                      date_parse_string &capture)
{
    /* no matches yet */
    int bestlen = 0;
    int bestidx = 0;

    /* skip leading spaces */
    for ( ; lstlen != 0 && is_space(*lst) ; ++lst, --lstlen) ;
    
    /* keep going until we're out of list */
    for (int idx = 1 ; lstlen != 0 ; )
    {
        /* find the next delimiter */
        const char *p = lst;
        size_t rem = lstlen;
        for ( ; rem != 0 && *p != '=' && *p != ',' && *p != ';' ; ++p, --rem) ;

        /* try matching this text */
        const char *curstr = str;
        size_t curlen = len;
        date_parse_string part;
        if (p - lst != 0 && match_lit(curstr, curlen, lst, p - lst, part))
        {
            /* if this is the best one so far, remember it */
            if (curstr - str > bestlen)
            {
                bestlen = curstr - str;
                bestidx = idx;
            }
        }

        /* 
         *   If we're at an '=', an alias for this same item follows, so keep
         *   going without upping the index.  If we're at a comma, we're on
         *   to the next item.  If we're at a ';' or the end of the string,
         *   it's the end of the list, so we've failed to find a match.
         */
        if (rem == 0 || *p == ';')
        {
            /* end of the list */
            break;
        }
        else if (*p == ',')
        {
            /* next list item follows - up the index */
            ++idx;

            /* skip the comma and any spaces before the next item */
            for (++p, --rem ; rem != 0 && is_space(*p) ; ++p, --rem) ;
        }
        else if (*p == '=')
        {
            /* alias - just skip the '=' */
            ++p, --rem;
        }

        /* on to the next item */
        lst = p;
        lstlen = rem;
    }

    /* if we found a match, return it */
    if (bestlen != 0)
    {
        capture.p = str;
        capture.len = bestlen;
        acc = bestidx;
        str += bestlen;
        len -= bestlen;
        return TRUE;
    }
    else
        return FALSE;
}